

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::TestGroup::init(TestGroup *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  *this_00;
  char **this_01;
  BindFunc *pBVar1;
  char **this_02;
  TestLog **this_03;
  TestContext **this_04;
  Type **this_05;
  undefined8 uVar2;
  undefined8 uVar3;
  Context *pCVar4;
  PtrData<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  data;
  RenderContext *renderCtx;
  TestGroup *this_06;
  int iVar5;
  undefined4 uVar6;
  int extraout_EAX;
  ES2Types *this_07;
  ProgramSources *pPVar7;
  undefined4 extraout_var;
  TestCaseGroup *this_08;
  TestCase *this_09;
  undefined4 extraout_var_00;
  TestError *this_10;
  undefined1 in_stack_fffffffffffffdcc [12];
  Context local_228;
  ES2Types *local_218;
  Type *local_210;
  Context *local_208;
  Type *local_200;
  Type *local_1f8;
  TestGroup *local_1f0;
  undefined1 local_1e8 [40];
  UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
  local_1c0;
  string local_1b0 [32];
  value_type local_190;
  string local_170;
  string local_150;
  undefined1 local_130 [40];
  Type *types [4];
  Type *local_e8 [18];
  _Vector_impl_data local_58;
  
  pCVar4 = (this->super_TestCaseGroup).m_context;
  uVar2 = pCVar4->m_testCtx;
  uVar3 = pCVar4->m_renderCtx;
  local_228.m_testCtx._0_4_ = (int)uVar2;
  local_228.m_renderCtx = (RenderContext *)uVar3;
  local_228.m_testCtx._4_4_ = (int)((ulong)uVar2 >> 0x20);
  this_07 = (ES2Types *)operator_new(0xab0);
  deqp::gls::LifetimeTests::details::ES2Types::ES2Types(this_07,&local_228);
  (this_07->super_Types)._vptr_Types = (_func_int **)&PTR_getProgramType_01e211b8;
  renderCtx = local_228.m_renderCtx;
  memset(types,0,0xac);
  local_58._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_58._M_finish._1_7_ = 0;
  stack0xffffffffffffffb8 = SUB169((undefined1  [16])0x0,7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "#version 100\nattribute vec4 pos; uniform float scale; void main () { gl_Position = vec4(scale * pos.xy, pos.zw); }\n"
             ,(allocator<char> *)&stack0xfffffffffffffdd7);
  glu::VertexSource::VertexSource((VertexSource *)local_1e8,&local_150);
  pPVar7 = glu::ProgramSources::operator<<((ProgramSources *)types,(ShaderSource *)local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,
             "#version 100\nvoid main () { gl_FragColor = vec4(1.0, 0.0, 1.0, 1.0); }\n",
             (allocator<char> *)&stack0xfffffffffffffdd6);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_130,&local_170);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)local_130);
  pPVar7->transformFeedbackBufferMode = 0x8c8c;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"gl_Position",(allocator<char> *)&stack0xfffffffffffffdd5);
  std::__cxx11::string::string((string *)&local_190,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pPVar7->transformFeedbackVaryings,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string((string *)(local_130 + 8));
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_150);
  local_218 = this_07 + 1;
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)(this_07 + 1),renderCtx,(ProgramSources *)types);
  glu::ProgramSources::~ProgramSources((ProgramSources *)types);
  *(RenderContext **)&this_07[1].m_bufferBind.m_bindTarget = local_228.m_renderCtx;
  iVar5 = (*(local_228.m_renderCtx)->_vptr_RenderContext[3])();
  if ((char)this_07[1].m_bufferBind.m_bindFunc != '\0') {
    uVar6 = (**(code **)(CONCAT44(extraout_var,iVar5) + 0xb48))
                      (*(undefined4 *)
                        &this_07[1].m_bufferBind.super_Binder.super_ContextWrapper.
                         super_CallLogWrapper.m_gl,"scale");
    *(undefined4 *)&this_07[1].m_bufferBind.m_genRequired = uVar6;
    uVar6 = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x780))
                      (*(undefined4 *)
                        &this_07[1].m_bufferBind.super_Binder.super_ContextWrapper.
                         super_CallLogWrapper.m_gl,"pos");
    *(undefined4 *)&this_07[1].m_bufferBind.field_0x4c = uVar6;
    deqp::gls::LifetimeTests::details::Binder::Binder((Binder *)&this_07[1].m_bufferType,&local_228)
    ;
    this_07[1].m_bufferType.super_Type._vptr_Type = (_func_int **)&PTR__Binder_01e211f8;
    this_01 = &this_07[1].m_bufferType.m_getName;
    local_1f0 = this;
    deqp::gls::LifetimeTests::details::Type::Type((Type *)this_01,&local_228);
    this_07[1].m_bufferType.m_getName = (char *)&PTR__Type_01e6d500;
    *(char **)&this_07[1].m_bufferType.field_0x60 = "query";
    this_07[1].m_bufferType.m_binder = (Binder *)glu::CallLogWrapper::glGenQueries;
    *(undefined8 *)&this_07[1].m_bufferType.m_genCreates = 0;
    this_07[1].m_textureBind.super_Binder._vptr_Binder =
         (_func_int **)glu::CallLogWrapper::glDeleteQueries;
    this_07[1].m_textureBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_gl =
         (Functions *)0x0;
    this_07[1].m_textureBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)glu::CallLogWrapper::glIsQuery;
    *(undefined8 *)
     &this_07[1].m_textureBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog =
         0;
    this_07[1].m_textureBind.super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)&this_07[1].m_bufferType;
    *(undefined1 *)&this_07[1].m_textureBind.super_Binder.super_ContextWrapper.m_ctx.m_testCtx = 0;
    pBVar1 = &this_07[1].m_textureBind.m_bindFunc;
    deqp::gls::LifetimeTests::details::SimpleBinder::SimpleBinder
              ((SimpleBinder *)pBVar1,&local_228,0x1555540,0,0x8e22,true);
    local_210 = (Type *)&this_07[1].m_textureType.m_getName;
    deqp::gls::LifetimeTests::details::Type::Type(local_210,&local_228);
    this_07[1].m_textureType.m_getName = (char *)&PTR__Type_01e6d500;
    *(char **)&this_07[1].m_textureType.field_0x60 = "transform_feedback";
    this_07[1].m_textureType.m_binder = (Binder *)glu::CallLogWrapper::glGenTransformFeedbacks;
    *(undefined8 *)&this_07[1].m_textureType.m_genCreates = 0;
    this_07[1].m_rboBind.super_Binder._vptr_Binder =
         (_func_int **)glu::CallLogWrapper::glDeleteTransformFeedbacks;
    this_07[1].m_rboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_gl =
         (Functions *)0x0;
    this_07[1].m_rboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)glu::CallLogWrapper::glIsTransformFeedback;
    *(undefined8 *)
     &this_07[1].m_rboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = 0;
    this_07[1].m_rboBind.super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)pBVar1;
    *(undefined1 *)&this_07[1].m_rboBind.super_Binder.super_ContextWrapper.m_ctx.m_testCtx = 0;
    pBVar1 = &this_07[1].m_rboBind.m_bindFunc;
    uVar6 = 1;
    deqp::gls::LifetimeTests::details::SimpleBinder::SimpleBinder
              ((SimpleBinder *)pBVar1,&local_228,0,0,0,true);
    this_07[1].m_rboBind.m_bindFunc = (BindFunc)&PTR__Binder_01e21248;
    this_02 = &this_07[1].m_rboType.m_getName;
    deqp::gls::LifetimeTests::details::Type::Type((Type *)this_02,&local_228);
    this_07[1].m_rboType.m_getName = (char *)&PTR__Type_01e6d500;
    *(char **)&this_07[1].m_rboType.field_0x60 = "vertex_array";
    this_07[1].m_rboType.m_binder = (Binder *)glu::CallLogWrapper::glGenVertexArrays;
    *(undefined8 *)&this_07[1].m_rboType.m_genCreates = 0;
    this_07[1].m_fboBind.super_Binder._vptr_Binder =
         (_func_int **)glu::CallLogWrapper::glDeleteVertexArrays;
    this_07[1].m_fboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_gl =
         (Functions *)0x0;
    this_07[1].m_fboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)glu::CallLogWrapper::glIsVertexArray;
    *(undefined8 *)
     &this_07[1].m_fboBind.super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = 0;
    this_07[1].m_fboBind.super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)pBVar1;
    *(undefined1 *)&this_07[1].m_fboBind.super_Binder.super_ContextWrapper.m_ctx.m_testCtx = 0;
    pBVar1 = &this_07[1].m_fboBind.m_bindFunc;
    deqp::gls::LifetimeTests::details::Binder::Binder((Binder *)pBVar1,&local_228);
    this_07[1].m_fboBind.m_bindFunc = (BindFunc)&PTR__Binder_01e21298;
    local_200 = (Type *)&this_07[1].m_fboType.super_Type.super_ContextWrapper.super_CallLogWrapper.
                         m_log;
    local_208 = pCVar4;
    local_1f8 = (Type *)this_01;
    deqp::gls::LifetimeTests::details::Type::Type(local_200,&local_228);
    this_07[1].m_fboType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)&PTR__Type_01e6d500;
    *(char **)&this_07[1].m_fboType.field_0x40 = "sampler";
    this_07[1].m_fboType.m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glGenSamplers;
    *(undefined8 *)&this_07[1].m_fboType.field_0x50 = 0;
    this_07[1].m_fboType.m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glDeleteSamplers;
    *(undefined8 *)&this_07[1].m_fboType.field_0x60 = 0;
    this_07[1].m_fboType.m_binder = (Binder *)glu::CallLogWrapper::glIsSampler;
    *(undefined8 *)&this_07[1].m_fboType.m_genCreates = 0;
    this_07[1].m_shaderType.super_Type._vptr_Type = (_func_int **)pBVar1;
    *(undefined1 *)
     &this_07[1].m_shaderType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_gl = 1;
    this_03 = &this_07[1].m_shaderType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log;
    deqp::gls::LifetimeTests::details::Attacher::Attacher
              ((Attacher *)this_03,&local_228,&(this_07->m_bufferType).super_Type,(Type *)this_02);
    this_07[1].m_shaderType.super_Type.super_ContextWrapper.super_CallLogWrapper.m_log =
         (TestLog *)&PTR_initAttachment_01e212e8;
    this_07[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
         (RenderContext *)local_218;
    this_04 = &this_07[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_testCtx;
    deqp::gls::LifetimeTests::details::InputAttacher::InputAttacher
              ((InputAttacher *)this_04,(Attacher *)this_03);
    this_07[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_testCtx =
         (TestContext *)&PTR_drawContainer_01e21348;
    this_07[1].m_texFboAtt.super_FboAttacher.super_Attacher.m_elementType =
         (Type *)this_07[1].m_programType.super_Type.super_ContextWrapper.m_ctx.m_renderCtx;
    this_05 = &this_07[1].m_texFboAtt.super_FboAttacher.super_Attacher.m_containerType;
    deqp::gls::LifetimeTests::details::Attacher::Attacher
              ((Attacher *)this_05,&local_228,&(this_07->m_bufferType).super_Type,local_210);
    this_07[1].m_texFboAtt.super_FboAttacher.super_Attacher.m_containerType =
         (Type *)&PTR_initAttachment_01e21378;
    deqp::gls::LifetimeTests::details::OutputAttacher::OutputAttacher
              (&this_07[1].m_texFboOutAtt.super_OutputAttacher,(Attacher *)this_05);
    this_07[1].m_texFboOutAtt.super_OutputAttacher._vptr_OutputAttacher =
         (_func_int **)&PTR_setupContainer_01e213d8;
    this_07[1].m_rboFboAtt.super_FboAttacher.super_Attacher._vptr_Attacher = (_func_int **)local_218
    ;
    types[0] = local_1f8;
    types[1] = local_210;
    types[3] = local_200;
    types[2] = (Type *)this_02;
    std::
    vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
    ::insert<deqp::gls::LifetimeTests::details::Type**,void>
              ((vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
                *)&(this_07->super_Types).m_types,
               (const_iterator)
               (this_07->super_Types).m_types.
               super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,types,local_e8);
    this_00 = &(this_07->super_Types).m_attachers;
    local_1e8._0_8_ = this_03;
    std::
    vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
              ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
                *)this_00,(Attacher **)local_1e8);
    local_1e8._0_8_ = this_05;
    std::
    vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
              ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
                *)this_00,(Attacher **)local_1e8);
    local_1e8._0_8_ = this_04;
    std::
    vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
              ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
                *)&(this_07->super_Types).m_inAttachers,(InputAttacher **)local_1e8);
    local_1e8._0_8_ = &this_07[1].m_texFboOutAtt;
    std::
    vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
    ::emplace_back<deqp::gls::LifetimeTests::details::OutputAttacher*>
              ((vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
                *)&(this_07->super_Types).m_outAttachers,(OutputAttacher **)local_1e8);
    this_06 = local_1f0;
    local_1c0.m_data.ptr = (Types *)0x0;
    data._4_12_ = in_stack_fffffffffffffdcc;
    data.ptr._0_4_ = uVar6;
    de::details::
    UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
    ::assignData(&(local_1f0->m_types).
                  super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
                 ,data);
    pCVar4 = local_208;
    de::details::
    UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
    ::~UniqueBase(&local_1c0);
    deqp::gls::LifetimeTests::details::addTestCases
              ((TestCaseGroup *)this_06,
               (this_06->m_types).
               super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
               .m_data.ptr);
    this_08 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(this_08,pCVar4,"delete_active","Delete active object");
    tcu::TestNode::addChild((TestNode *)this_06,(TestNode *)this_08);
    this_09 = (TestCase *)operator_new(0x90);
    gles3::TestCase::TestCase(this_09,pCVar4,"transform_feedback","Transform Feedback");
    iVar5 = (*pCVar4->m_renderCtx->_vptr_RenderContext[3])();
    glu::CallLogWrapper::CallLogWrapper
              ((CallLogWrapper *)(this_09 + 1),(Functions *)CONCAT44(extraout_var_00,iVar5),
               pCVar4->m_testCtx->m_log);
    (this_09->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TfDeleteActiveTest_01e21410;
    *(undefined1 *)&this_09[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 1;
    tcu::TestNode::addChild((TestNode *)this_08,(TestNode *)this_09);
    return extraout_EAX;
  }
  this_10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_10,(char *)0x0,"isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
             ,0x5a);
  __cxa_throw(this_10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TestGroup::init (void)
{
	gles3::Context&	ctx		= getContext();
	lt::Context		ltCtx	(ctx.getRenderContext(), ctx.getTestContext());

	m_types	= MovePtr<Types>(new ES3Types(ltCtx));

	addTestCases(*this, *m_types);

	TestCaseGroup* deleteActiveGroup =
		new TestCaseGroup(ctx, "delete_active", "Delete active object");
	addChild(deleteActiveGroup);
	deleteActiveGroup->addChild(
		new TfDeleteActiveTest(ctx, "transform_feedback", "Transform Feedback"));
}